

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map_test.cc
# Opt level: O0

void __thiscall
bloaty::RangeMapTest_UnknownSize_Test::RangeMapTest_UnknownSize_Test
          (RangeMapTest_UnknownSize_Test *this)

{
  RangeMapTest *in_RDI;
  
  RangeMapTest::RangeMapTest(in_RDI);
  (in_RDI->super_Test)._vptr_Test = (_func_int **)&PTR__RangeMapTest_UnknownSize_Test_00914c98;
  return;
}

Assistant:

TEST_F(RangeMapTest, UnknownSize) {
  map_.AddRange(5, kUnknownSize, "foo");
  CheckConsistency();
  AssertMainMapEquals({
    {5, UINT64_MAX, kNoTranslation, "foo"}
  });

  map_.AddRange(100, 15, "bar");
  map_.AddRange(200, kUnknownSize, "baz");
  CheckConsistency();
  AssertMainMapEquals({
    {5, 100, kNoTranslation, "foo"},
    {100, 115, kNoTranslation, "bar"},
    {200, UINT64_MAX, kNoTranslation, "baz"}
  });

  map2_.AddRange(5, 110, "base0");
  map2_.AddRange(200, 50, "base1");

  AssertRollupEquals({&map2_, &map_}, {
    {{"base0", "foo"}, 5, 100},
    {{"base0", "bar"}, 100, 115},
    {{"base1", "baz"}, 200, 250},
  });
}